

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_buffer.hpp
# Opt level: O1

BooleanArray2D * __thiscall
CircularBuffer<BooleanArray2D_*>::push
          (CircularBuffer<BooleanArray2D_*> *this,BooleanArray2D *element)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  BooleanArray2D *pBVar3;
  
  if (this->count_of_slots == this->count_of_elements) {
    iVar2 = (*this->_vptr_CircularBuffer[3])(this);
    pBVar3 = (BooleanArray2D *)CONCAT44(extraout_var,iVar2);
  }
  else {
    pBVar3 = (BooleanArray2D *)0x0;
  }
  uVar1 = this->count_of_elements;
  if (uVar1 == 0) {
    this->first_element_index = 0;
    this->last_element_index = 0;
  }
  else if (this->last_element_index == this->count_of_slots - 1) {
    this->last_element_index = 0;
  }
  else {
    this->last_element_index = this->last_element_index + 1;
  }
  this->data[this->last_element_index] = element;
  this->count_of_elements = uVar1 + 1;
  return pBVar3;
}

Assistant:

T *CircularBuffer<T *>::push(T *element)
{
    T *ret;
    if(count_of_slots == count_of_elements) {
        //remove first element to make room for the new one, return it so the caller can deal with removed element
        ret = pop();
    } else {
        ret = nullptr;
    }
    if(count_of_elements == 0) {
        first_element_index = 0;
        last_element_index = 0;
    } else {
        if(last_element_index == count_of_slots - 1) {
            last_element_index = 0;
        } else {
            last_element_index++;
        }
    }
    data[last_element_index] = element;
    count_of_elements++;
    return ret;
}